

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O0

void __thiscall
ModelFlattening_importingComponentUsingEmptyUnitReference_Test::
ModelFlattening_importingComponentUsingEmptyUnitReference_Test
          (ModelFlattening_importingComponentUsingEmptyUnitReference_Test *this)

{
  ModelFlattening_importingComponentUsingEmptyUnitReference_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this =
       &PTR__ModelFlattening_importingComponentUsingEmptyUnitReference_Test_001a3e28;
  return;
}

Assistant:

TEST(ModelFlattening, importingComponentUsingEmptyUnitReference)
{
    const std::string unitsDefinitionModelString =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"units_definitions\">\n"
        "  <units name=\"empty_ref\">\n"
        "    <unit units=\"\"/>\n"
        "  </units>\n"
        "  <units name=\"\">\n"
        "    <unit units=\"second\"/>\n"
        "  </units>\n"
        "</model>";
    const std::string importModelString =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"change_model\">\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"units_definitions.cellml\">\n"
        "    <units units_ref=\"empty_ref\" name=\"empty_ref\"/>\n"
        "  </import>\n"
        "  <component name=\"change\">\n"
        "    <variable name=\"var1\" units=\"empty_ref\"/>\n"
        "  </component>\n"
        "</model>";
    const std::string modelString =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"multiple_clash\">\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"change_model.cellml\">\n"
        "    <component component_ref=\"change\" name=\"change\"/>\n"
        "  </import>\n"
        "</model>";
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"multiple_clash\">\n"
        "  <units name=\"empty_ref\">\n"
        "    <unit units=\"\"/>\n"
        "  </units>\n"
        "  <component name=\"change\">\n"
        "    <variable name=\"var1\" units=\"empty_ref\"/>\n"
        "  </component>\n"
        "</model>\n";

    auto importer = libcellml::Importer::create();
    auto parser = libcellml::Parser::create();
    auto validator = libcellml::Validator::create();

    auto model = parser->parseModel(modelString);
    auto importModel = parser->parseModel(importModelString);
    auto unitsDefinitionModel = parser->parseModel(unitsDefinitionModelString);

    EXPECT_TRUE(model->hasUnresolvedImports());

    importer->addModel(importModel, "change_model.cellml");
    importer->addModel(unitsDefinitionModel, "units_definitions.cellml");

    importer->resolveImports(model, ".");
    auto flattenedModel = importer->flattenModel(model);
    EXPECT_EQ(size_t(1), flattenedModel->unitsCount());

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    const std::string a = printer->printModel(flattenedModel);
    EXPECT_EQ(e, a);
}